

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

void helicsFederateInitializingEntryCallback
               (HelicsFederate fed,_func_void_HelicsBool_void_ptr *initializingEntry,void *userdata,
               HelicsError *err)

{
  Federate *this;
  FedObject *pFVar1;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  pFVar1 = helics::getFedObject(fed,err);
  if ((pFVar1 != (FedObject *)0x0) &&
     (this = (pFVar1->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr, this != (Federate *)0x0)) {
    if (initializingEntry == (_func_void_HelicsBool_void_ptr *)0x0) {
      local_48 = (code *)0x0;
      uStack_40 = 0;
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      helics::Federate::setInitializingEntryCallback(this,(function<void_(bool)> *)&local_58);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
    }
    else {
      local_20 = std::
                 _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/FederateExport.cpp:1307:17)>
                 ::_M_invoke;
      local_28 = std::
                 _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/FederateExport.cpp:1307:17)>
                 ::_M_manager;
      local_38._M_unused._0_8_ = (undefined8)initializingEntry;
      local_38._8_8_ = userdata;
      helics::Federate::setInitializingEntryCallback(this,(function<void_(bool)> *)&local_38);
      if (local_28 != (code *)0x0) {
        (*local_28)(&local_38,&local_38,__destroy_functor);
      }
    }
  }
  return;
}

Assistant:

void helicsFederateInitializingEntryCallback(HelicsFederate fed,
                                             void (*initializingEntry)(HelicsBool iterating, void* userdata),
                                             void* userdata,
                                             HelicsError* err)
{
    auto* fedptr = getFed(fed, err);
    if (fedptr == nullptr) {
        return;
    }

    try {
        if (initializingEntry == nullptr) {
            fedptr->setInitializingEntryCallback({});
        } else {
            fedptr->setInitializingEntryCallback(
                [initializingEntry, userdata](bool iterating) { initializingEntry(iterating ? HELICS_TRUE : HELICS_FALSE, userdata); });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}